

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int CVodeSetDeltaGammaMaxBadJac(void *cvode_mem,sunrealtype dgmax_jbad)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_20;
  double local_18;
  CVodeMem local_8;
  
  local_18 = dgmax_jbad;
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetDeltaGammaMaxBadJac",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->dgmax_jbad =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x3fc999999999999a |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetDeltaGammaMaxBadJac(void* cvode_mem, sunrealtype dgmax_jbad)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* Access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Set value or use default */
  if (dgmax_jbad <= ZERO) { cvls_mem->dgmax_jbad = CVLS_DGMAX; }
  else { cvls_mem->dgmax_jbad = dgmax_jbad; }

  return (CVLS_SUCCESS);
}